

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

bool ImPlot::BeginDragDropSource(ImGuiKeyModFlags key_mods,ImGuiDragDropFlags flags)

{
  ImPlotPlot *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImGuiIO *pIVar4;
  long lVar5;
  ImRect rect;
  ImRect local_38;
  
  pIVar4 = ImGui::GetIO();
  if (pIVar4->KeyMods == key_mods) {
    pIVar1 = GImPlot->CurrentPlot;
    (pIVar1->XAxis).Dragging = false;
    for (lVar5 = 0; lVar5 != 0x180; lVar5 = lVar5 + 0x80) {
      (&pIVar1->YAxis[0].Dragging)[lVar5] = false;
    }
  }
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,0x990f3e);
  local_38.Min = (GImPlot->CurrentPlot->PlotRect).Min;
  local_38.Max = (GImPlot->CurrentPlot->PlotRect).Max;
  bVar3 = false;
  bVar2 = ImGui::ItemAdd(&local_38,id,&local_38,0);
  if (bVar2) {
    bVar3 = BeginDragDropSourceEx(id,GImPlot->CurrentPlot->PlotHovered,flags,key_mods);
  }
  return bVar3;
}

Assistant:

bool BeginDragDropSource(ImGuiKeyModFlags key_mods, ImGuiDragDropFlags flags) {
    if (ImGui::GetIO().KeyMods == key_mods) {
        GImPlot->CurrentPlot->XAxis.Dragging = false;
        for (int i = 0; i < IMPLOT_Y_AXES; ++i)
            GImPlot->CurrentPlot->YAxis[i].Dragging = false;
    }
    const ImGuiID ID = GImGui->CurrentWindow->GetID(IMPLOT_ID_PLT);
    ImRect rect = GImPlot->CurrentPlot->PlotRect;
    return  ImGui::ItemAdd(rect, ID, &rect) && BeginDragDropSourceEx(ID, GImPlot->CurrentPlot->PlotHovered, flags, key_mods);
}